

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thybrjc.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int njev;
  int nfev;
  int local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  double x [9];
  double diag [9];
  double wa4 [9];
  double wa3 [9];
  double wa2 [9];
  double wa1 [9];
  double qtf [9];
  double fvec [9];
  double r [45];
  double fjac [81];
  
  lVar2 = 0;
  do {
    auVar7._8_4_ = (int)lVar2;
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar7 = (auVar7 | _DAT_00104010) ^ _DAT_00104020;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffff7) {
      x[lVar2] = -1.0;
      x[lVar2 + 1] = -1.0;
    }
    lVar2 = lVar2 + 2;
  } while (lVar2 != 10);
  local_6b8 = -0x80000000;
  uStack_6b4 = 0x80000000;
  uStack_6b0 = 0x80000000;
  uStack_6ac = 0x80000000;
  dVar6 = dpmpar(1);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  lVar2 = 0;
  do {
    auVar8._8_4_ = (int)lVar2;
    auVar8._0_8_ = lVar2;
    auVar8._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar7 = (auVar8 | _DAT_00104010) ^ _DAT_00104020;
    if (auVar7._4_4_ == local_6b8 && auVar7._0_4_ < -0x7ffffff7) {
      diag[lVar2] = 1.0;
      diag[lVar2 + 1] = 1.0;
    }
    lVar2 = lVar2 + 2;
  } while (lVar2 != 10);
  lVar2 = 0;
  uVar1 = hybrj(fcn,(void *)0x0,9,x,fvec,fjac,9,dVar6,1000,diag,2,100.0,0,&nfev,&njev,r,0x2d,qtf,wa1
                ,wa2,wa3,wa4);
  enorm(9,fvec);
  uVar5 = 1;
  printf("     final l2 norm of the residuals%15.7g\n\n");
  printf("     number of function evaluations%10i\n\n",(ulong)(uint)nfev);
  printf("     number of jacobian evaluations%10i\n\n",(ulong)(uint)njev);
  printf("     exit parameter                %10i\n\n",(ulong)uVar1);
  puts("     final approximate solution\n");
  cVar3 = '\0';
  do {
    pcVar4 = "\n     ";
    if ((char)((char)(uVar5 / 3) * '\x03' + cVar3) != '\0') {
      pcVar4 = "";
    }
    printf("%s%15.7g",x[lVar2],pcVar4);
    cVar3 = cVar3 + -1;
    uVar5 = (uint)(byte)((char)uVar5 + 1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  putchar(10);
  return 0;
}

Assistant:

int main()
{
#if (defined(__MINGW32__) && !defined(_UCRT)) || (defined(_MSC_VER) && (_MSC_VER < 1900))
  _set_output_format(_TWO_DIGIT_EXPONENT);
#endif

  int j, n, ldfjac, maxfev, mode, nprint, info, nfev, njev, lr;
  real xtol, factor, fnorm;
  real x[9], fvec[9], fjac[9*9], diag[9], r[45], qtf[9],
    wa1[9], wa2[9], wa3[9], wa4[9];
  void *p = NULL;
#ifdef BOX_CONSTRAINTS
  real xmin[9] = {-2.,-0.5, -2., -2., -2., -2., -2., -2., -2.};
  real xmax[9] = { 2.,  2.,  2.,  2.,  2.,  2.,  2.,  2.,  2.};
  fcndata_t data;
  data.xmin = xmin;
  data.xmax = xmax;
  p = &data;
#endif

  n = 9;

/*      the following starting values provide a rough solution. */

  for (j=1; j<=9; j++) {
    x[j-1] = -1.;
  }

  ldfjac = 9;
  lr = 45;

/*      set xtol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  xtol = sqrt(__cminpack_func__(dpmpar)(1));

  maxfev = 1000;
  mode = 2;
  for (j=1; j<=9; j++) {
    diag[j-1] = 1.;
  }
  factor = 1.e2;
  nprint = 0;

  info = __cminpack_func__(hybrj)(fcn, p, n, x, fvec, fjac, ldfjac, xtol, maxfev, diag, 
	mode, factor, nprint, &nfev, &njev, r, lr, qtf, 
	wa1, wa2, wa3, wa4);
#ifdef BOX_CONSTRAINTS
  /* compute the real x, using the same change of variable as in fcn */
  for (j = 0; j < 3; ++j) {
    real xmiddle = (xmin[j]+xmax[j])/2.;
    real xwidth = (xmax[j]-xmin[j])/2.;
    real th =  tanh((x[j]-xmiddle)/xwidth);
    x[j] = xmiddle + th * xwidth;
  }
#endif
 fnorm = __cminpack_func__(enorm)(n, fvec);

 printf("     final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
 printf("     number of function evaluations%10i\n\n", nfev);
 printf("     number of jacobian evaluations%10i\n\n", njev);
 printf("     exit parameter                %10i\n\n", info);
 printf("     final approximate solution\n\n");
 for (j=1; j<=n; j++) {
   printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
 }
 printf("\n");
 return 0;
}